

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O3

bool __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::readMPS(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this,istream *p_input,NameSet *p_rnames,NameSet *p_cnames,DIdxSet *p_intvars)

{
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar1;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  DataKey *pDVar2;
  uint *puVar3;
  char cVar4;
  SPxOut *pSVar5;
  ostream *poVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  int32_t iVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  NameSet *pNVar17;
  NameSet *this_01;
  bool bVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  char *pcVar22;
  cpp_dec_float<100U,_int,_void> *pcVar23;
  size_t sVar24;
  pointer pnVar25;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar26;
  int __c;
  long in_FS_OFFSET;
  double dVar27;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *rset;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  Verbosity old_verbosity;
  char rhsname [256];
  undefined1 local_6f8 [16];
  undefined1 local_6e8 [16];
  undefined1 local_6d8 [16];
  uint local_6c8 [3];
  undefined3 uStack_6bb;
  int iStack_6b8;
  bool bStack_6b4;
  undefined8 local_6b0;
  undefined1 local_6a8 [16];
  undefined1 local_698 [16];
  undefined1 local_688 [16];
  uint local_678 [3];
  undefined3 uStack_66b;
  int iStack_668;
  bool bStack_664;
  undefined8 local_660;
  NameSet *local_650;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_648;
  undefined8 uStack_640;
  NameSet *local_630;
  double local_628;
  undefined8 uStack_620;
  DIdxSet *local_610;
  undefined1 local_608 [16];
  undefined1 local_5f8 [16];
  undefined1 local_5e8 [16];
  uint local_5d8 [3];
  undefined3 uStack_5cb;
  int iStack_5c8;
  bool bStack_5c4;
  undefined8 local_5c0;
  undefined1 local_509;
  SPxOut *local_500;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_4f8;
  undefined1 local_4f0 [8];
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_4e8;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_4d8;
  NameSet *local_4d0;
  undefined1 local_4c8 [88];
  uint auStack_470 [2];
  uint local_468 [2];
  uint auStack_460 [2];
  uint local_458 [2];
  uint auStack_450 [2];
  uint local_448 [2];
  uint auStack_440 [2];
  int local_438;
  bool local_434;
  fpclass_type local_430;
  int32_t iStack_42c;
  _func_int **local_428;
  int iStack_420;
  int iStack_41c;
  int *local_418;
  undefined8 uStack_410;
  uint local_408 [2];
  uint auStack_400 [2];
  uint local_3f8 [2];
  uint auStack_3f0 [2];
  int local_3e8;
  bool local_3e4;
  fpclass_type local_3e0;
  int32_t iStack_3dc;
  undefined **local_3d8 [3];
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_3c0;
  NameSet *local_3b0;
  double local_3a8;
  undefined8 uStack_3a0;
  undefined1 local_390 [304];
  char *pcStack_260;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  char local_238;
  char local_138 [256];
  undefined2 local_38;
  int local_34;
  
  local_610 = p_intvars;
  local_4d0 = p_cnames;
  if (p_cnames == (NameSet *)0x0) {
    local_650 = (NameSet *)0x0;
    spx_alloc<soplex::NameSet*>(&local_650,1);
    p_cnames = local_650;
    NameSet::NameSet(local_650,10000,-1,2.0,2.0);
  }
  local_650 = p_cnames;
  NameSet::clear(p_cnames);
  local_3b0 = p_rnames;
  if (p_rnames == (NameSet *)0x0) {
    local_630 = (NameSet *)0x0;
    spx_alloc<soplex::NameSet*>(&local_630,1);
    p_rnames = local_630;
    NameSet::NameSet(local_630,10000,-1,2.0,2.0);
  }
  this_00 = &this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  local_630 = p_rnames;
  NameSet::clear(p_rnames);
  clear(this);
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::memRemax(&this_00->
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ,100000);
  local_4f8 = this_00;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reMax(this_00,10000);
  local_390._0_8_ = &PTR__MPSInput_0069d4f8;
  local_390._8_4_ = NAME;
  local_390._24_4_ = 0;
  local_390._28_4_ = MINIMIZE;
  local_390[0x20] = false;
  local_390[0x21] = '\0';
  local_38._0_1_ = false;
  local_38._1_1_ = false;
  local_34 = 0;
  local_138[0] = '\0';
  stack0xfffffffffffffd98 = (undefined1  [16])0x0;
  local_258 = (undefined1  [16])0x0;
  local_248 = (undefined1  [16])0x0;
  local_238 = '\0';
  local_390._16_8_ = p_input;
  MPSreadName((MPSInput *)local_390,this->spxout);
  if (local_390._8_4_ == OBJSEN) {
    MPSreadObjsen((MPSInput *)local_390);
  }
  if (local_390._8_4_ == OBJNAME) {
    bVar18 = MPSInput::readLine((MPSInput *)local_390);
    if ((!bVar18) || (pcStack_260 == (char *)0x0)) {
LAB_00378c5e:
      MPSInput::syntaxError((MPSInput *)local_390);
      goto LAB_00378c72;
    }
    spxSnprintf(local_138,0x100,"%s");
    bVar18 = MPSInput::readLine((MPSInput *)local_390);
    if ((!bVar18) ||
       (((char *)local_390._296_8_ == (char *)0x0 ||
        (iVar19 = strcmp((char *)local_390._296_8_,"ROWS"), iVar19 != 0)))) goto LAB_00378c5e;
    local_390._8_4_ = ROWS;
  }
  else {
LAB_00378c72:
    if (local_390._8_4_ != ROWS) goto LAB_0037917d;
  }
  pNVar17 = local_630;
  local_500 = this->spxout;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::LPRowBase((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)local_4c8,0);
  local_648 = *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                **)(in_FS_OFFSET + -8);
  uStack_640 = 0;
  local_628 = -(double)local_648;
  uStack_620 = 0x8000000000000000;
  while (bVar18 = MPSInput::readLine((MPSInput *)local_390), pSVar5 = local_500, bVar18) {
    if ((char *)local_390._296_8_ != (char *)0x0) {
      if ((local_500 != (SPxOut *)0x0) && (3 < (int)local_500->m_verbosity)) {
        local_608._0_4_ = local_500->m_verbosity;
        local_6f8._0_4_ = 4;
        (*local_500->_vptr_SPxOut[2])(local_500);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar5->m_streams[pSVar5->m_verbosity],"IMPSRD02 Objective name : ",0x1a);
        poVar6 = pSVar5->m_streams[pSVar5->m_verbosity];
        sVar24 = strlen(local_138);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_138,sVar24);
        cVar4 = (char)pSVar5->m_streams[pSVar5->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar5->m_streams[pSVar5->m_verbosity] + -0x18) + cVar4);
        std::ostream::put(cVar4);
        std::ostream::flush();
        (*pSVar5->_vptr_SPxOut[2])(pSVar5,local_608);
      }
      iVar19 = strcmp((char *)local_390._296_8_,"COLUMNS");
      if (iVar19 == 0) {
        local_390._8_4_ = COLUMNS;
        goto LAB_0037915c;
      }
      break;
    }
    if ((pcStack_260 == (char *)0x0) || ((char *)local_258._0_8_ == (char *)0x0)) break;
    if (*pcStack_260 == 'N') {
      if (local_138[0] == '\0') {
        spxSnprintf(local_138,0x100,"%s");
      }
    }
    else {
      local_608._0_8_ = local_258._0_8_;
      pcVar22 = DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::index
                          (&pNVar17->hashtab,(char *)local_608,__c);
      if (-1 < (int)pcVar22) break;
      NameSet::add(pNVar17,(char *)local_258._0_8_);
      cVar4 = *pcStack_260;
      if (cVar4 == 'E') {
        pcVar23 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
        local_4c8._64_4_ = pcVar23->exp;
        local_4c8[0x44] = pcVar23->neg;
        local_4c8._0_4_ = (pcVar23->data)._M_elems[0];
        local_4c8._4_4_ = (pcVar23->data)._M_elems[1];
        local_4c8._8_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 2);
        local_4c8._16_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 4);
        local_4c8._24_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 6);
        local_4c8._32_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 8);
        local_4c8._40_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 10);
        local_4c8._48_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 0xc);
        local_4c8._56_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 0xe);
        local_4c8._72_4_ = pcVar23->fpclass;
        local_4c8._76_4_ = pcVar23->prec_elem;
        pcVar23 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
LAB_00379006:
        local_438 = pcVar23->exp;
        local_434 = pcVar23->neg;
        local_430 = pcVar23->fpclass;
        iStack_42c = pcVar23->prec_elem;
        local_4c8._80_4_ = (pcVar23->data)._M_elems[0];
        local_4c8._84_4_ = (pcVar23->data)._M_elems[1];
        auStack_470 = *(uint (*) [2])((pcVar23->data)._M_elems + 2);
        local_468 = *(uint (*) [2])((pcVar23->data)._M_elems + 4);
        auStack_460 = *(uint (*) [2])((pcVar23->data)._M_elems + 6);
        local_458 = *(uint (*) [2])((pcVar23->data)._M_elems + 8);
        auStack_450 = *(uint (*) [2])((pcVar23->data)._M_elems + 10);
        local_448 = *(uint (*) [2])((pcVar23->data)._M_elems + 0xc);
        auStack_440 = *(uint (*) [2])((pcVar23->data)._M_elems + 0xe);
      }
      else {
        if (cVar4 == 'L') {
          ::soplex::infinity::__tls_init();
          local_5c0._0_4_ = cpp_dec_float_finite;
          local_5c0._4_4_ = 0x10;
          local_608 = (undefined1  [16])0x0;
          local_5f8 = (undefined1  [16])0x0;
          local_5e8 = (undefined1  [16])0x0;
          local_5d8[0] = 0;
          local_5d8[1] = 0;
          stack0xfffffffffffffa30 = 0;
          uStack_5cb = 0;
          iStack_5c8 = 0;
          bStack_5c4 = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)local_608,local_628);
          local_4c8._61_3_ = uStack_5cb;
          local_4c8._56_5_ = stack0xfffffffffffffa30;
          local_4c8._48_4_ = local_5d8[0];
          local_4c8._52_4_ = local_5d8[1];
          local_4c8._32_8_ = local_5e8._0_8_;
          local_4c8._40_8_ = local_5e8._8_8_;
          local_4c8._16_8_ = local_5f8._0_8_;
          local_4c8._24_8_ = local_5f8._8_8_;
          local_4c8._0_8_ = local_608._0_8_;
          local_4c8._8_8_ = local_608._8_8_;
          local_4c8._64_4_ = iStack_5c8;
          local_4c8[0x44] = bStack_5c4;
          local_4c8._72_4_ = (fpclass_type)local_5c0;
          local_4c8._76_4_ = local_5c0._4_4_;
          pcVar23 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
          goto LAB_00379006;
        }
        if (cVar4 != 'G') break;
        pcVar23 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
        local_4c8._64_4_ = pcVar23->exp;
        local_4c8[0x44] = pcVar23->neg;
        local_4c8._0_4_ = (pcVar23->data)._M_elems[0];
        local_4c8._4_4_ = (pcVar23->data)._M_elems[1];
        local_4c8._8_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 2);
        local_4c8._16_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 4);
        local_4c8._24_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 6);
        local_4c8._32_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 8);
        local_4c8._40_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 10);
        local_4c8._48_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 0xc);
        local_4c8._56_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 0xe);
        local_4c8._72_4_ = pcVar23->fpclass;
        local_4c8._76_4_ = pcVar23->prec_elem;
        ::soplex::infinity::__tls_init();
        local_5c0._0_4_ = cpp_dec_float_finite;
        local_5c0._4_4_ = 0x10;
        local_608 = (undefined1  [16])0x0;
        local_5f8 = (undefined1  [16])0x0;
        local_5e8 = (undefined1  [16])0x0;
        local_5d8[0] = 0;
        local_5d8[1] = 0;
        stack0xfffffffffffffa30 = 0;
        uStack_5cb = 0;
        iStack_5c8 = 0;
        bStack_5c4 = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)local_608,(double)local_648);
        auVar16 = local_5e8;
        auVar15 = local_5f8;
        auStack_440[1]._1_3_ = uStack_5cb;
        auStack_440._0_5_ = stack0xfffffffffffffa30;
        local_448[0] = local_5d8[0];
        local_448[1] = local_5d8[1];
        local_458[0] = local_5e8._0_4_;
        local_458[1] = local_5e8._4_4_;
        auStack_450[0] = local_5e8._8_4_;
        auStack_450[1] = local_5e8._12_4_;
        local_468[0] = local_5f8._0_4_;
        local_468[1] = local_5f8._4_4_;
        auStack_460[0] = local_5f8._8_4_;
        auStack_460[1] = local_5f8._12_4_;
        local_4c8._80_8_ = local_608._0_8_;
        auStack_470[0] = local_608._8_4_;
        auStack_470[1] = local_608._12_4_;
        local_438 = iStack_5c8;
        local_434 = bStack_5c4;
        local_430 = (fpclass_type)local_5c0;
        iStack_42c = local_5c0._4_4_;
        local_5f8 = auVar15;
        local_5e8 = auVar16;
      }
      local_608._0_8_ = 0xffffffff00000000;
      LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add(&this->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ,(DataKey *)local_608,
            (LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)local_4c8);
    }
  }
  MPSInput::syntaxError((MPSInput *)local_390);
LAB_0037915c:
  local_3d8[0] = &PTR__DSVectorBase_006a3d50;
  if (local_3c0 !=
      (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0) {
    free(local_3c0);
  }
LAB_0037917d:
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x50])();
  this_01 = local_630;
  pNVar17 = local_650;
  if (local_390._8_4_ == COLUMNS) {
    iVar19 = (this->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum;
    local_660._0_4_ = cpp_dec_float_finite;
    local_660._4_4_ = 0x10;
    local_6a8 = (undefined1  [16])0x0;
    local_698 = (undefined1  [16])0x0;
    local_688 = (undefined1  [16])0x0;
    local_678[0] = 0;
    local_678[1] = 0;
    stack0xfffffffffffff990 = 0;
    uStack_66b = 0;
    iStack_668 = 0;
    bStack_664 = false;
    memset(local_608,0,0x100);
    LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::LPColBase((LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)local_4c8,iVar19);
    local_4e8.m_elem =
         (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
    local_4e8.memsize = 0;
    local_4e8.memused = 0;
    local_4f0 = (undefined1  [8])&PTR__DSVectorBase_006a3d50;
    local_4d8 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x0;
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::allocMem((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)local_4f0,8);
    pcVar23 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
    local_3e8 = pcVar23->exp;
    local_3e4 = pcVar23->neg;
    local_3e0 = pcVar23->fpclass;
    iStack_3dc = pcVar23->prec_elem;
    local_428 = *(_func_int ***)(pcVar23->data)._M_elems;
    iStack_420 = (pcVar23->data)._M_elems[2];
    iStack_41c = (pcVar23->data)._M_elems[3];
    local_418 = *(int **)((pcVar23->data)._M_elems + 4);
    uStack_410 = *(undefined8 *)((pcVar23->data)._M_elems + 6);
    local_408 = *(uint (*) [2])((pcVar23->data)._M_elems + 8);
    auStack_400 = *(uint (*) [2])((pcVar23->data)._M_elems + 10);
    local_3f8 = *(uint (*) [2])((pcVar23->data)._M_elems + 0xc);
    auStack_3f0 = *(uint (*) [2])((pcVar23->data)._M_elems + 0xe);
    local_4e8.memused = 0;
    local_628 = *(double *)(in_FS_OFFSET + -8);
LAB_003792bf:
    bVar18 = MPSInput::readLine((MPSInput *)local_390);
    if (bVar18) {
      if ((char *)local_390._296_8_ != (char *)0x0) {
        iVar19 = strcmp((char *)local_390._296_8_,"RHS");
        if (iVar19 == 0) {
          if (local_608[0] != (cpp_dec_float<100u,int,void>)0x0) {
            DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ::operator=((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         *)local_3d8,&local_4e8);
            local_6f8._0_8_ = 0xffffffff00000000;
            LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::add(local_4f8,(DataKey *)local_6f8,
                  (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)local_4c8);
          }
          local_390._8_4_ = RHS;
          goto LAB_00379968;
        }
        goto LAB_00379954;
      }
      pcVar22 = pcStack_260;
      if (((pcStack_260 == (char *)0x0) || ((char *)local_258._0_8_ == (char *)0x0)) ||
         ((char *)local_258._8_8_ == (char *)0x0)) goto LAB_00379954;
      iVar19 = strcmp(local_608,pcStack_260);
      if (iVar19 != 0) {
        if (local_608[0] != (cpp_dec_float<100u,int,void>)0x0) {
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
          ::operator=((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       *)local_3d8,&local_4e8);
          local_6f8._0_8_ = 0xffffffff00000000;
          LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add(local_4f8,(DataKey *)local_6f8,
                (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)local_4c8);
          pcVar22 = pcStack_260;
        }
        spxSnprintf(local_608,0xff,"%s",pcVar22);
        local_509 = 0;
        iVar19 = (pNVar17->set).thesize;
        NameSet::add(pNVar17,local_608);
        if ((pNVar17->set).thesize <= iVar19) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "ERROR in COLUMNS: duplicate column name or not column-wise ordering",0x43);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
          std::ostream::put(-0x80);
          std::ostream::flush();
          goto LAB_00379954;
        }
        local_4e8.memused = 0;
        pcVar23 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
        local_3e8 = pcVar23->exp;
        local_3e4 = pcVar23->neg;
        local_3e0 = pcVar23->fpclass;
        iStack_3dc = pcVar23->prec_elem;
        local_428 = *(_func_int ***)(pcVar23->data)._M_elems;
        iStack_420 = (pcVar23->data)._M_elems[2];
        iStack_41c = (pcVar23->data)._M_elems[3];
        local_418 = *(int **)((pcVar23->data)._M_elems + 4);
        uStack_410 = *(undefined8 *)((pcVar23->data)._M_elems + 6);
        local_408 = *(uint (*) [2])((pcVar23->data)._M_elems + 8);
        auStack_400 = *(uint (*) [2])((pcVar23->data)._M_elems + 10);
        local_3f8 = *(uint (*) [2])((pcVar23->data)._M_elems + 0xc);
        auStack_3f0 = *(uint (*) [2])((pcVar23->data)._M_elems + 0xe);
        pcVar23 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
        local_438 = pcVar23->exp;
        local_434 = pcVar23->neg;
        local_430 = pcVar23->fpclass;
        iStack_42c = pcVar23->prec_elem;
        local_4c8._80_4_ = (pcVar23->data)._M_elems[0];
        local_4c8._84_4_ = (pcVar23->data)._M_elems[1];
        auStack_470 = *(uint (*) [2])((pcVar23->data)._M_elems + 2);
        local_468 = *(uint (*) [2])((pcVar23->data)._M_elems + 4);
        auStack_460 = *(uint (*) [2])((pcVar23->data)._M_elems + 6);
        local_458 = *(uint (*) [2])((pcVar23->data)._M_elems + 8);
        auStack_450 = *(uint (*) [2])((pcVar23->data)._M_elems + 10);
        local_448 = *(uint (*) [2])((pcVar23->data)._M_elems + 0xc);
        auStack_440 = *(uint (*) [2])((pcVar23->data)._M_elems + 0xe);
        ::soplex::infinity::__tls_init();
        local_6b0._0_4_ = cpp_dec_float_finite;
        local_6b0._4_4_ = 0x10;
        local_6f8 = ZEXT816(0);
        local_6e8 = ZEXT816(0);
        local_6d8 = ZEXT816(0);
        local_6c8[0] = 0;
        local_6c8[1] = 0;
        stack0xfffffffffffff940 = 0;
        uStack_6bb = 0;
        iStack_6b8 = 0;
        bStack_6b4 = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)local_6f8,local_628);
        local_4c8._61_3_ = uStack_6bb;
        local_4c8._56_5_ = stack0xfffffffffffff940;
        local_4c8._48_4_ = local_6c8[0];
        local_4c8._52_4_ = local_6c8[1];
        local_4c8._32_8_ = local_6d8._0_8_;
        local_4c8._40_8_ = local_6d8._8_8_;
        local_4c8._16_8_ = local_6e8._0_8_;
        local_4c8._24_8_ = local_6e8._8_8_;
        local_4c8._0_8_ = local_6f8._0_8_;
        local_4c8._8_8_ = local_6f8._8_8_;
        local_4c8._64_4_ = iStack_6b8;
        local_4c8[0x44] = bStack_6b4;
        local_4c8._72_4_ = (fpclass_type)local_6b0;
        local_4c8._76_4_ = local_6b0._4_4_;
        if (local_38._0_1_ == true) {
          if (local_610 != (DIdxSet *)0x0) {
            iVar19 = NameSet::number(pNVar17,local_608);
            DIdxSet::addIdx(local_610,iVar19);
          }
          pcVar23 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::one();
          local_4c8._64_4_ = pcVar23->exp;
          local_4c8[0x44] = pcVar23->neg;
          local_4c8._0_4_ = (pcVar23->data)._M_elems[0];
          local_4c8._4_4_ = (pcVar23->data)._M_elems[1];
          local_4c8._8_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 2);
          local_4c8._16_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 4);
          local_4c8._24_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 6);
          local_4c8._32_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 8);
          local_4c8._40_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 10);
          local_4c8._48_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 0xc);
          local_4c8._56_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 0xe);
          local_4c8._72_4_ = pcVar23->fpclass;
          local_4c8._76_4_ = pcVar23->prec_elem;
        }
      }
      dVar27 = atof((char *)local_258._8_8_);
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)local_6a8,dVar27);
      uVar7 = local_258._0_8_;
      iVar19 = strcmp((char *)local_258._0_8_,local_138);
      auVar16 = local_688;
      auVar15 = local_6a8;
      if (iVar19 == 0) {
        auStack_3f0[1]._1_3_ = uStack_66b;
        auStack_3f0._0_5_ = stack0xfffffffffffff990;
        local_3f8[0] = local_678[0];
        local_3f8[1] = local_678[1];
        local_408[0] = local_688._0_4_;
        local_408[1] = local_688._4_4_;
        auStack_400[0] = local_688._8_4_;
        auStack_400[1] = local_688._12_4_;
        local_418 = (int *)local_698._0_8_;
        uStack_410 = local_698._8_8_;
        local_428 = (_func_int **)local_6a8._0_8_;
        iStack_420 = local_6a8._8_4_;
        iStack_41c = local_6a8._12_4_;
        local_3e8 = iStack_668;
        local_3e4 = bStack_664;
        local_3e0 = (fpclass_type)local_660;
        iStack_3dc = local_660._4_4_;
        local_6a8 = auVar15;
        local_688 = auVar16;
      }
      else {
        iVar19 = NameSet::number(this_01,(char *)uVar7);
        if (iVar19 < 0) {
          MPSInput::entryIgnored
                    ((MPSInput *)local_390,"Column",pcStack_260,"row",(char *)local_258._0_8_);
        }
        else {
          if ((fpclass_type)local_660 != cpp_dec_float_NaN) {
            local_6b0._0_4_ = cpp_dec_float_finite;
            local_6b0._4_4_ = 0x10;
            local_6f8 = (undefined1  [16])0x0;
            local_6e8 = (undefined1  [16])0x0;
            local_6d8 = (undefined1  [16])0x0;
            local_6c8[0] = 0;
            local_6c8[1] = 0;
            stack0xfffffffffffff940 = 0;
            uStack_6bb = 0;
            iStack_6b8 = 0;
            bStack_6b4 = false;
            pcVar23 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
            local_6f8 = *(undefined1 (*) [16])(pcVar23->data)._M_elems;
            local_6e8 = *(undefined1 (*) [16])((pcVar23->data)._M_elems + 4);
            local_6d8 = *(undefined1 (*) [16])((pcVar23->data)._M_elems + 8);
            local_6c8._0_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 0xc);
            uVar7 = *(undefined8 *)((pcVar23->data)._M_elems + 0xe);
            stack0xfffffffffffff940 = (undefined5)uVar7;
            uStack_6bb = (undefined3)((ulong)uVar7 >> 0x28);
            iStack_6b8 = pcVar23->exp;
            bStack_6b4 = pcVar23->neg;
            local_6b0._0_4_ = pcVar23->fpclass;
            local_6b0._4_4_ = pcVar23->prec_elem;
            iVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)local_6a8,
                                (cpp_dec_float<100U,_int,_void> *)local_6f8);
            if (iVar20 == 0) goto LAB_00379707;
          }
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)local_4f0,iVar19,
                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_6a8);
        }
      }
LAB_00379707:
      if ((char *)local_248._8_8_ != (char *)0x0) {
        dVar27 = atof((char *)local_248._8_8_);
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)local_6a8,dVar27);
        uVar7 = local_248._0_8_;
        iVar19 = strcmp((char *)local_248._0_8_,local_138);
        auVar16 = local_688;
        auVar15 = local_6a8;
        if (iVar19 == 0) {
          auStack_3f0[1]._1_3_ = uStack_66b;
          auStack_3f0._0_5_ = stack0xfffffffffffff990;
          local_3f8[0] = local_678[0];
          local_3f8[1] = local_678[1];
          local_408[0] = local_688._0_4_;
          local_408[1] = local_688._4_4_;
          auStack_400[0] = local_688._8_4_;
          auStack_400[1] = local_688._12_4_;
          local_418 = (int *)local_698._0_8_;
          uStack_410 = local_698._8_8_;
          local_428 = (_func_int **)local_6a8._0_8_;
          iStack_420 = local_6a8._8_4_;
          iStack_41c = local_6a8._12_4_;
          local_3e8 = iStack_668;
          local_3e4 = bStack_664;
          local_3e0 = (fpclass_type)local_660;
          iStack_3dc = local_660._4_4_;
          local_6a8 = auVar15;
          local_688 = auVar16;
          goto LAB_003792bf;
        }
        iVar19 = NameSet::number(this_01,(char *)uVar7);
        if (-1 < iVar19) {
          if ((fpclass_type)local_660 != cpp_dec_float_NaN) {
            local_6b0._0_4_ = cpp_dec_float_finite;
            local_6b0._4_4_ = 0x10;
            local_6f8 = (undefined1  [16])0x0;
            local_6e8 = (undefined1  [16])0x0;
            local_6d8 = (undefined1  [16])0x0;
            local_6c8[0] = 0;
            local_6c8[1] = 0;
            stack0xfffffffffffff940 = 0;
            uStack_6bb = 0;
            iStack_6b8 = 0;
            bStack_6b4 = false;
            pcVar23 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
            local_6f8 = *(undefined1 (*) [16])(pcVar23->data)._M_elems;
            local_6e8 = *(undefined1 (*) [16])((pcVar23->data)._M_elems + 4);
            local_6d8 = *(undefined1 (*) [16])((pcVar23->data)._M_elems + 8);
            local_6c8._0_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 0xc);
            uVar7 = *(undefined8 *)((pcVar23->data)._M_elems + 0xe);
            stack0xfffffffffffff940 = (undefined5)uVar7;
            uStack_6bb = (undefined3)((ulong)uVar7 >> 0x28);
            iStack_6b8 = pcVar23->exp;
            bStack_6b4 = pcVar23->neg;
            local_6b0._0_4_ = pcVar23->fpclass;
            local_6b0._4_4_ = pcVar23->prec_elem;
            iVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)local_6a8,
                                (cpp_dec_float<100U,_int,_void> *)local_6f8);
            if (iVar20 == 0) goto LAB_003792bf;
          }
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)local_4f0,iVar19,
                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_6a8);
          goto LAB_003792bf;
        }
        MPSInput::entryIgnored
                  ((MPSInput *)local_390,"Column",pcStack_260,"row",(char *)local_248._0_8_);
      }
      goto LAB_003792bf;
    }
LAB_00379954:
    MPSInput::syntaxError((MPSInput *)local_390);
LAB_00379968:
    local_4f0 = (undefined1  [8])&PTR__DSVectorBase_006a3d50;
    if (local_4d8 !=
        (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      free(local_4d8);
    }
    local_3d8[0] = &PTR__DSVectorBase_006a3d50;
    if (local_3c0 !=
        (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      free(local_3c0);
    }
  }
  pNVar17 = local_630;
  if (local_390._8_4_ == RHS) {
    pSVar5 = this->spxout;
    memset((DataKey *)local_4c8,0,0x100);
    memset(local_608,0,0x100);
    local_6b0._0_4_ = cpp_dec_float_finite;
    local_6b0._4_4_ = 0x10;
    local_6f8 = (undefined1  [16])0x0;
    local_6e8 = (undefined1  [16])0x0;
    local_6d8 = (undefined1  [16])0x0;
    local_6c8[0] = 0;
    local_6c8[1] = 0;
    stack0xfffffffffffff940 = 0;
    uStack_6bb = 0;
    iStack_6b8 = 0;
    bStack_6b4 = false;
    bVar18 = MPSInput::readLine((MPSInput *)local_390);
    if (bVar18) {
      local_628 = *(double *)(in_FS_OFFSET + -8);
      uStack_620 = 0;
      local_648 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((ulong)local_628 ^ 0x8000000000000000);
      uStack_640 = 0x8000000000000000;
      while ((char *)local_390._296_8_ == (char *)0x0) {
        if (((char *)local_258._0_8_ != (char *)0x0 && (char *)local_258._8_8_ == (char *)0x0) ||
           (((char *)local_248._0_8_ != (char *)0x0 && ((char *)local_248._8_8_ == (char *)0x0)))) {
          MPSInput::insertName((MPSInput *)local_390,"_RHS_",false);
        }
        if (((pcStack_260 == (char *)0x0) || ((char *)local_258._0_8_ == (char *)0x0)) ||
           ((char *)local_258._8_8_ == (char *)0x0)) goto LAB_0037a1c7;
        pcVar22 = pcStack_260;
        if (local_4c8[0] == '\0') {
          spxSnprintf((char *)local_4c8,0x100,"%s",pcStack_260);
          pcVar22 = pcStack_260;
        }
        iVar19 = strcmp((char *)local_4c8,pcVar22);
        if (iVar19 == 0) {
          uVar21 = NameSet::number(pNVar17,(char *)local_258._0_8_);
          if ((int)uVar21 < 0) {
            MPSInput::entryIgnored
                      ((MPSInput *)local_390,"RHS",pcStack_260,"row",(char *)local_258._0_8_);
          }
          else {
            dVar27 = atof((char *)local_258._8_8_);
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)local_6f8,dVar27);
            pcVar23 = &(this->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).right.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar21].m_backend;
            ::soplex::infinity::__tls_init();
            local_660._0_4_ = cpp_dec_float_finite;
            local_660._4_4_ = 0x10;
            local_6a8 = (undefined1  [16])0x0;
            local_698 = (undefined1  [16])0x0;
            local_688 = (undefined1  [16])0x0;
            local_678[0] = 0;
            local_678[1] = 0;
            stack0xfffffffffffff990 = 0;
            uStack_66b = 0;
            iStack_668 = 0;
            bStack_664 = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)local_6a8,local_628);
            if (((pcVar23->fpclass != cpp_dec_float_NaN) &&
                ((fpclass_type)local_660 != cpp_dec_float_NaN)) &&
               (iVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar23,(cpp_dec_float<100U,_int,_void> *)local_6a8),
               auVar15 = local_6f8, local_6f8 = auVar15, iVar19 < 0)) {
              pnVar25 = (this->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).right.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 0xc;
              *(undefined8 *)puVar3 = local_6c8._0_8_;
              *(ulong *)(puVar3 + 2) = CONCAT35(uStack_6bb,stack0xfffffffffffff940);
              puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 8;
              *(undefined8 *)puVar3 = local_6d8._0_8_;
              *(undefined8 *)(puVar3 + 2) = local_6d8._8_8_;
              puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 4;
              *(undefined8 *)puVar3 = local_6e8._0_8_;
              *(undefined8 *)(puVar3 + 2) = local_6e8._8_8_;
              pDVar2 = (DataKey *)(pnVar25 + uVar21);
              pDVar2->info = local_6f8._0_4_;
              pDVar2->idx = local_6f8._4_4_;
              pDVar2[1].info = local_6f8._8_4_;
              pDVar2[1].idx = local_6f8._12_4_;
              pnVar25[uVar21].m_backend.exp = iStack_6b8;
              pnVar25[uVar21].m_backend.neg = bStack_6b4;
              pnVar25[uVar21].m_backend.fpclass = (fpclass_type)local_6b0;
              pnVar25[uVar21].m_backend.prec_elem = local_6b0._4_4_;
            }
            pcVar23 = &(this->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).left.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar21].m_backend;
            ::soplex::infinity::__tls_init();
            local_660._0_4_ = cpp_dec_float_finite;
            local_660._4_4_ = 0x10;
            local_6a8 = (undefined1  [16])0x0;
            local_698 = (undefined1  [16])0x0;
            local_688 = (undefined1  [16])0x0;
            local_678[0] = 0;
            local_678[1] = 0;
            stack0xfffffffffffff990 = 0;
            uStack_66b = 0;
            iStack_668 = 0;
            bStack_664 = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)local_6a8,(double)local_648);
            if (((pcVar23->fpclass != cpp_dec_float_NaN) &&
                ((fpclass_type)local_660 != cpp_dec_float_NaN)) &&
               (iVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar23,(cpp_dec_float<100U,_int,_void> *)local_6a8),
               auVar15 = local_6f8, local_6f8 = auVar15, 0 < iVar19)) {
              pnVar25 = (this->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).left.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 0xc;
              *(undefined8 *)puVar3 = local_6c8._0_8_;
              *(ulong *)(puVar3 + 2) = CONCAT35(uStack_6bb,stack0xfffffffffffff940);
              puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 8;
              *(undefined8 *)puVar3 = local_6d8._0_8_;
              *(undefined8 *)(puVar3 + 2) = local_6d8._8_8_;
              puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 4;
              *(undefined8 *)puVar3 = local_6e8._0_8_;
              *(undefined8 *)(puVar3 + 2) = local_6e8._8_8_;
              pDVar2 = (DataKey *)(pnVar25 + uVar21);
              pDVar2->info = local_6f8._0_4_;
              pDVar2->idx = local_6f8._4_4_;
              pDVar2[1].info = local_6f8._8_4_;
              pDVar2[1].idx = local_6f8._12_4_;
              pnVar25[uVar21].m_backend.exp = iStack_6b8;
              pnVar25[uVar21].m_backend.neg = bStack_6b4;
              pnVar25[uVar21].m_backend.fpclass = (fpclass_type)local_6b0;
              pnVar25[uVar21].m_backend.prec_elem = local_6b0._4_4_;
            }
          }
          if ((char *)local_248._8_8_ != (char *)0x0) {
            uVar21 = NameSet::number(pNVar17,(char *)local_248._0_8_);
            if ((int)uVar21 < 0) {
              MPSInput::entryIgnored
                        ((MPSInput *)local_390,"RHS",pcStack_260,"row",(char *)local_248._0_8_);
            }
            else {
              dVar27 = atof((char *)local_248._8_8_);
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)local_6f8,dVar27);
              pcVar23 = &(this->
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).right.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar21].m_backend;
              ::soplex::infinity::__tls_init();
              local_660._0_4_ = cpp_dec_float_finite;
              local_660._4_4_ = 0x10;
              local_6a8 = (undefined1  [16])0x0;
              local_698 = (undefined1  [16])0x0;
              local_688 = (undefined1  [16])0x0;
              local_678[0] = 0;
              local_678[1] = 0;
              stack0xfffffffffffff990 = 0;
              uStack_66b = 0;
              iStack_668 = 0;
              bStack_664 = false;
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)local_6a8,local_628);
              if (((pcVar23->fpclass != cpp_dec_float_NaN) &&
                  ((fpclass_type)local_660 != cpp_dec_float_NaN)) &&
                 (iVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (pcVar23,(cpp_dec_float<100U,_int,_void> *)local_6a8),
                 auVar15 = local_6f8, local_6f8 = auVar15, iVar19 < 0)) {
                pnVar25 = (this->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).right.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 0xc;
                *(undefined8 *)puVar3 = local_6c8._0_8_;
                *(ulong *)(puVar3 + 2) = CONCAT35(uStack_6bb,stack0xfffffffffffff940);
                puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 8;
                *(undefined8 *)puVar3 = local_6d8._0_8_;
                *(undefined8 *)(puVar3 + 2) = local_6d8._8_8_;
                puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 4;
                *(undefined8 *)puVar3 = local_6e8._0_8_;
                *(undefined8 *)(puVar3 + 2) = local_6e8._8_8_;
                pDVar2 = (DataKey *)(pnVar25 + uVar21);
                pDVar2->info = local_6f8._0_4_;
                pDVar2->idx = local_6f8._4_4_;
                pDVar2[1].info = local_6f8._8_4_;
                pDVar2[1].idx = local_6f8._12_4_;
                pnVar25[uVar21].m_backend.exp = iStack_6b8;
                pnVar25[uVar21].m_backend.neg = bStack_6b4;
                pnVar25[uVar21].m_backend.fpclass = (fpclass_type)local_6b0;
                pnVar25[uVar21].m_backend.prec_elem = local_6b0._4_4_;
              }
              pcVar23 = &(this->
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).left.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar21].m_backend;
              ::soplex::infinity::__tls_init();
              local_660._0_4_ = cpp_dec_float_finite;
              local_660._4_4_ = 0x10;
              local_6a8 = (undefined1  [16])0x0;
              local_698 = (undefined1  [16])0x0;
              local_688 = (undefined1  [16])0x0;
              local_678[0] = 0;
              local_678[1] = 0;
              stack0xfffffffffffff990 = 0;
              uStack_66b = 0;
              iStack_668 = 0;
              bStack_664 = false;
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)local_6a8,(double)local_648);
              if (((pcVar23->fpclass != cpp_dec_float_NaN) &&
                  ((fpclass_type)local_660 != cpp_dec_float_NaN)) &&
                 (iVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (pcVar23,(cpp_dec_float<100U,_int,_void> *)local_6a8),
                 auVar15 = local_6f8, local_6f8 = auVar15, 0 < iVar19)) {
                pnVar25 = (this->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).left.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 0xc;
                *(undefined8 *)puVar3 = local_6c8._0_8_;
                *(ulong *)(puVar3 + 2) = CONCAT35(uStack_6bb,stack0xfffffffffffff940);
                puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 8;
                *(undefined8 *)puVar3 = local_6d8._0_8_;
                *(undefined8 *)(puVar3 + 2) = local_6d8._8_8_;
                puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 4;
                *(undefined8 *)puVar3 = local_6e8._0_8_;
                *(undefined8 *)(puVar3 + 2) = local_6e8._8_8_;
                pDVar2 = (DataKey *)(pnVar25 + uVar21);
                pDVar2->info = local_6f8._0_4_;
                pDVar2->idx = local_6f8._4_4_;
                pDVar2[1].info = local_6f8._8_4_;
                pDVar2[1].idx = local_6f8._12_4_;
                pnVar25[uVar21].m_backend.exp = iStack_6b8;
                pnVar25[uVar21].m_backend.neg = bStack_6b4;
                pnVar25[uVar21].m_backend.fpclass = (fpclass_type)local_6b0;
                pnVar25[uVar21].m_backend.prec_elem = local_6b0._4_4_;
              }
            }
          }
        }
        else {
          iVar19 = strcmp(local_608,pcVar22);
          if (((iVar19 != 0) && (spxSnprintf(local_608,0x100,"%s",pcVar22), pSVar5 != (SPxOut *)0x0)
              ) && (4 < (int)pSVar5->m_verbosity)) {
            local_6a8._0_4_ = pSVar5->m_verbosity;
            local_4f0._0_4_ = 5;
            (*pSVar5->_vptr_SPxOut[2])(pSVar5,local_4f0);
            std::__ostream_insert<char,std::char_traits<char>>
                      (pSVar5->m_streams[pSVar5->m_verbosity],"IMPSRD07 RHS ignored    : ",0x1a);
            poVar6 = pSVar5->m_streams[pSVar5->m_verbosity];
            sVar24 = strlen(local_608);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_608,sVar24);
            cVar4 = (char)pSVar5->m_streams[pSVar5->m_verbosity];
            std::ios::widen((char)*(undefined8 *)
                                   (*(long *)pSVar5->m_streams[pSVar5->m_verbosity] + -0x18) + cVar4
                           );
            std::ostream::put(cVar4);
            std::ostream::flush();
            (*pSVar5->_vptr_SPxOut[2])(pSVar5);
          }
        }
        bVar18 = MPSInput::readLine((MPSInput *)local_390);
        if (!bVar18) goto LAB_0037a1c7;
      }
      pcVar22 = (char *)local_390._296_8_;
      if ((pSVar5 != (SPxOut *)0x0) && (3 < (int)pSVar5->m_verbosity)) {
        local_6a8._0_4_ = pSVar5->m_verbosity;
        local_4f0._0_4_ = 4;
        (*pSVar5->_vptr_SPxOut[2])(pSVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar5->m_streams[pSVar5->m_verbosity],"IMPSRD03 RHS name       : ",0x1a);
        poVar6 = pSVar5->m_streams[pSVar5->m_verbosity];
        sVar24 = strlen((char *)local_4c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_4c8,sVar24);
        cVar4 = (char)pSVar5->m_streams[pSVar5->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar5->m_streams[pSVar5->m_verbosity] + -0x18) + cVar4);
        std::ostream::put(cVar4);
        std::ostream::flush();
        (*pSVar5->_vptr_SPxOut[2])(pSVar5,local_6a8);
        pcVar22 = (char *)local_390._296_8_;
      }
      iVar19 = strcmp(pcVar22,"RANGES");
      if (iVar19 == 0) {
        local_390._8_4_ = RANGES;
        goto LAB_0037a1db;
      }
      iVar19 = strcmp(pcVar22,"BOUNDS");
      if (iVar19 == 0) {
        local_390._8_4_ = BOUNDS;
        goto LAB_0037a1db;
      }
      iVar19 = strcmp(pcVar22,"ENDATA");
      if (iVar19 == 0) {
        local_390._8_4_ = ENDATA;
        goto LAB_0037a1db;
      }
    }
LAB_0037a1c7:
    MPSInput::syntaxError((MPSInput *)local_390);
  }
LAB_0037a1db:
  pNVar17 = local_630;
  if (local_390._8_4_ == RANGES) {
    pSVar5 = this->spxout;
    memset((DataKey *)local_4c8,0,0x100);
    local_6b0._0_4_ = cpp_dec_float_finite;
    local_6b0._4_4_ = 0x10;
    local_6f8 = (undefined1  [16])0x0;
    local_6e8 = (undefined1  [16])0x0;
    local_6d8 = (undefined1  [16])0x0;
    local_6c8[0] = 0;
    local_6c8[1] = 0;
    stack0xfffffffffffff940 = 0;
    uStack_6bb = 0;
    iStack_6b8 = 0;
    bStack_6b4 = false;
    bVar18 = MPSInput::readLine((MPSInput *)local_390);
    local_500 = pSVar5;
    if (bVar18) {
      pVVar1 = &(this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).left;
      local_3a8 = *(double *)(in_FS_OFFSET + -8);
      uStack_3a0 = 0;
      local_628 = -local_3a8;
      uStack_620 = 0x8000000000000000;
      local_648 = &(this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).right;
      while (pSVar5 = local_500, (char *)local_390._296_8_ == (char *)0x0) {
        if (((char *)local_258._0_8_ != (char *)0x0 && (char *)local_258._8_8_ == (char *)0x0) ||
           (((char *)local_248._0_8_ != (char *)0x0 && ((char *)local_248._8_8_ == (char *)0x0)))) {
          MPSInput::insertName((MPSInput *)local_390,"_RNG_",false);
        }
        if (((pcStack_260 == (char *)0x0) || ((char *)local_258._0_8_ == (char *)0x0)) ||
           ((char *)local_258._8_8_ == (char *)0x0)) goto LAB_0037af81;
        if (local_4c8[0] == '\0') {
          spxSnprintf((char *)local_4c8,0x100,"%s");
        }
        iVar19 = strcmp((char *)local_4c8,pcStack_260);
        if (iVar19 == 0) {
          uVar21 = NameSet::number(pNVar17,(char *)local_258._0_8_);
          if ((int)uVar21 < 0) {
            MPSInput::entryIgnored
                      ((MPSInput *)local_390,"Range",pcStack_260,"row",(char *)local_258._0_8_);
          }
          else {
            dVar27 = atof((char *)local_258._8_8_);
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)local_6f8,dVar27);
            pcVar23 = &(pVVar1->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar21].m_backend;
            ::soplex::infinity::__tls_init();
            local_5c0._0_4_ = cpp_dec_float_finite;
            local_5c0._4_4_ = 0x10;
            local_608 = (undefined1  [16])0x0;
            local_5f8 = (undefined1  [16])0x0;
            local_5e8 = (undefined1  [16])0x0;
            local_5d8[0] = 0;
            local_5d8[1] = 0;
            stack0xfffffffffffffa30 = 0;
            uStack_5cb = 0;
            iStack_5c8 = 0;
            bStack_5c4 = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)local_608,local_628);
            if (((pcVar23->fpclass != cpp_dec_float_NaN) &&
                ((fpclass_type)local_5c0 != cpp_dec_float_NaN)) &&
               (iVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar23,(cpp_dec_float<100U,_int,_void> *)local_608), 0 < iVar19
               )) {
              pcVar23 = &(local_648->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar21].m_backend;
              ::soplex::infinity::__tls_init();
              local_660._0_4_ = cpp_dec_float_finite;
              local_660._4_4_ = 0x10;
              local_6a8 = (undefined1  [16])0x0;
              local_698 = (undefined1  [16])0x0;
              local_688 = (undefined1  [16])0x0;
              local_678[0] = 0;
              local_678[1] = 0;
              stack0xfffffffffffff990 = 0;
              uStack_66b = 0;
              iStack_668 = 0;
              bStack_664 = false;
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)local_6a8,local_3a8);
              if (((pcVar23->fpclass != cpp_dec_float_NaN) &&
                  ((fpclass_type)local_660 != cpp_dec_float_NaN)) &&
                 (iVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (pcVar23,(cpp_dec_float<100U,_int,_void> *)local_6a8),
                 iVar19 < 0)) {
                if ((fpclass_type)local_6b0 == cpp_dec_float_NaN) {
LAB_0037adf1:
                  pVVar26 = pVVar1;
                }
                else {
                  local_5c0._0_4_ = cpp_dec_float_finite;
                  local_5c0._4_4_ = 0x10;
                  local_608 = (undefined1  [16])0x0;
                  local_5f8 = (undefined1  [16])0x0;
                  local_5e8 = (undefined1  [16])0x0;
                  local_5d8[0] = 0;
                  local_5d8[1] = 0;
                  stack0xfffffffffffffa30 = 0;
                  uStack_5cb = 0;
                  iStack_5c8 = 0;
                  bStack_5c4 = false;
                  iVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)local_6f8,
                                      (cpp_dec_float<100U,_int,_void> *)local_608);
                  pVVar26 = local_648;
                  if (iVar19 < 0) goto LAB_0037adf1;
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (&(pVVar26->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar21].m_backend,
                           (cpp_dec_float<100U,_int,_void> *)local_6f8);
                goto LAB_0037a887;
              }
            }
            pcVar23 = &(pVVar1->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar21].m_backend;
            ::soplex::infinity::__tls_init();
            local_5c0._0_4_ = cpp_dec_float_finite;
            local_5c0._4_4_ = 0x10;
            local_608 = (undefined1  [16])0x0;
            local_5f8 = (undefined1  [16])0x0;
            local_5e8 = (undefined1  [16])0x0;
            local_5d8[0] = 0;
            local_5d8[1] = 0;
            stack0xfffffffffffffa30 = 0;
            uStack_5cb = 0;
            iStack_5c8 = 0;
            bStack_5c4 = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)local_608,local_628);
            if (((pcVar23->fpclass == cpp_dec_float_NaN) ||
                ((fpclass_type)local_5c0 == cpp_dec_float_NaN)) ||
               (iVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar23,(cpp_dec_float<100U,_int,_void> *)local_608), iVar19 < 1
               )) {
              pcVar23 = &(local_648->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar21].m_backend;
              local_678[0] = local_6c8[0];
              local_678[1] = local_6c8[1];
              stack0xfffffffffffff990 = stack0xfffffffffffff940;
              uStack_66b = uStack_6bb;
              local_688 = local_6d8;
              local_698 = local_6e8;
              local_6a8 = local_6f8;
              auVar15 = local_6a8;
              iStack_668 = iStack_6b8;
              bStack_664 = bStack_6b4;
              local_660._0_4_ = (fpclass_type)local_6b0;
              local_660._4_4_ = local_6b0._4_4_;
              if ((bStack_6b4 == true) &&
                 (local_6a8._0_4_ = local_6f8._0_4_,
                 (fpclass_type)local_6b0 != cpp_dec_float_finite || local_6a8._0_4_ != 0)) {
                bStack_664 = false;
              }
              local_5c0._0_4_ = cpp_dec_float_finite;
              local_5c0._4_4_ = 0x10;
              local_608 = (undefined1  [16])0x0;
              local_5f8 = (undefined1  [16])0x0;
              local_5e8 = (undefined1  [16])0x0;
              local_5d8[0] = 0;
              local_5d8[1] = 0;
              stack0xfffffffffffffa30 = 0;
              uStack_5cb = 0;
              iStack_5c8 = 0;
              bStack_5c4 = false;
              if ((cpp_dec_float<100U,_int,_void> *)local_608 != pcVar23) {
                local_608 = *(undefined1 (*) [16])(pcVar23->data)._M_elems;
                local_5f8 = *(undefined1 (*) [16])((pcVar23->data)._M_elems + 4);
                local_5e8 = *(undefined1 (*) [16])((pcVar23->data)._M_elems + 8);
                local_5d8._0_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 0xc);
                uVar7 = *(undefined8 *)((pcVar23->data)._M_elems + 0xe);
                stack0xfffffffffffffa30 = (undefined5)uVar7;
                uStack_5cb = (undefined3)((ulong)uVar7 >> 0x28);
                iStack_5c8 = pcVar23->exp;
                bStack_5c4 = pcVar23->neg;
                local_5c0._0_4_ = pcVar23->fpclass;
                local_5c0._4_4_ = pcVar23->prec_elem;
              }
              local_6a8 = auVar15;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        ((cpp_dec_float<100U,_int,_void> *)local_608,
                         (cpp_dec_float<100U,_int,_void> *)local_6a8);
              pnVar25 = (pVVar1->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            else {
              pcVar23 = &(pVVar1->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar21].m_backend;
              local_678[0] = local_6c8[0];
              local_678[1] = local_6c8[1];
              stack0xfffffffffffff990 = stack0xfffffffffffff940;
              uStack_66b = uStack_6bb;
              local_688 = local_6d8;
              local_698 = local_6e8;
              local_6a8 = local_6f8;
              auVar15 = local_6a8;
              iStack_668 = iStack_6b8;
              bStack_664 = bStack_6b4;
              local_660._0_4_ = (fpclass_type)local_6b0;
              local_660._4_4_ = local_6b0._4_4_;
              if ((bStack_6b4 == true) &&
                 (local_6a8._0_4_ = local_6f8._0_4_,
                 (fpclass_type)local_6b0 != cpp_dec_float_finite || local_6a8._0_4_ != 0)) {
                bStack_664 = false;
              }
              local_5c0._0_4_ = cpp_dec_float_finite;
              local_5c0._4_4_ = 0x10;
              local_608 = (undefined1  [16])0x0;
              local_5f8 = (undefined1  [16])0x0;
              local_5e8 = (undefined1  [16])0x0;
              local_5d8[0] = 0;
              local_5d8[1] = 0;
              stack0xfffffffffffffa30 = 0;
              uStack_5cb = 0;
              iStack_5c8 = 0;
              bStack_5c4 = false;
              if ((cpp_dec_float<100U,_int,_void> *)local_608 != pcVar23) {
                local_608 = *(undefined1 (*) [16])(pcVar23->data)._M_elems;
                local_5f8 = *(undefined1 (*) [16])((pcVar23->data)._M_elems + 4);
                local_5e8 = *(undefined1 (*) [16])((pcVar23->data)._M_elems + 8);
                local_5d8._0_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 0xc);
                uVar7 = *(undefined8 *)((pcVar23->data)._M_elems + 0xe);
                stack0xfffffffffffffa30 = (undefined5)uVar7;
                uStack_5cb = (undefined3)((ulong)uVar7 >> 0x28);
                iStack_5c8 = pcVar23->exp;
                bStack_5c4 = pcVar23->neg;
                local_5c0._0_4_ = pcVar23->fpclass;
                local_5c0._4_4_ = pcVar23->prec_elem;
              }
              local_6a8 = auVar15;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        ((cpp_dec_float<100U,_int,_void> *)local_608,
                         (cpp_dec_float<100U,_int,_void> *)local_6a8);
              pnVar25 = (local_648->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            auVar15 = local_608;
            puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 0xc;
            *(undefined8 *)puVar3 = local_5d8._0_8_;
            *(ulong *)(puVar3 + 2) = CONCAT35(uStack_5cb,stack0xfffffffffffffa30);
            puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 8;
            *(undefined8 *)puVar3 = local_5e8._0_8_;
            *(undefined8 *)(puVar3 + 2) = local_5e8._8_8_;
            puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar3 = local_5f8._0_8_;
            *(undefined8 *)(puVar3 + 2) = local_5f8._8_8_;
            pDVar2 = (DataKey *)(pnVar25 + uVar21);
            pDVar2->info = local_608._0_4_;
            pDVar2->idx = local_608._4_4_;
            pDVar2[1].info = local_608._8_4_;
            pDVar2[1].idx = local_608._12_4_;
            pnVar25[uVar21].m_backend.exp = iStack_5c8;
            pnVar25[uVar21].m_backend.neg = bStack_5c4;
            pnVar25[uVar21].m_backend.fpclass = (fpclass_type)local_5c0;
            pnVar25[uVar21].m_backend.prec_elem = local_5c0._4_4_;
            local_608 = auVar15;
          }
LAB_0037a887:
          if ((char *)local_248._8_8_ != (char *)0x0) {
            uVar21 = NameSet::number(pNVar17,(char *)local_248._0_8_);
            if ((int)uVar21 < 0) {
              MPSInput::entryIgnored
                        ((MPSInput *)local_390,"Range",pcStack_260,"row",(char *)local_248._0_8_);
            }
            else {
              dVar27 = atof((char *)local_248._8_8_);
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)local_6f8,dVar27);
              pcVar23 = &(pVVar1->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar21].m_backend;
              ::soplex::infinity::__tls_init();
              local_5c0._0_4_ = cpp_dec_float_finite;
              local_5c0._4_4_ = 0x10;
              local_608 = (undefined1  [16])0x0;
              local_5f8 = (undefined1  [16])0x0;
              local_5e8 = (undefined1  [16])0x0;
              local_5d8[0] = 0;
              local_5d8[1] = 0;
              stack0xfffffffffffffa30 = 0;
              uStack_5cb = 0;
              iStack_5c8 = 0;
              bStack_5c4 = false;
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)local_608,local_628);
              if (((pcVar23->fpclass != cpp_dec_float_NaN) &&
                  ((fpclass_type)local_5c0 != cpp_dec_float_NaN)) &&
                 (iVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (pcVar23,(cpp_dec_float<100U,_int,_void> *)local_608),
                 0 < iVar19)) {
                pcVar23 = &(local_648->val).
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar21].m_backend;
                ::soplex::infinity::__tls_init();
                local_660._0_4_ = cpp_dec_float_finite;
                local_660._4_4_ = 0x10;
                local_6a8 = (undefined1  [16])0x0;
                local_698 = (undefined1  [16])0x0;
                local_688 = (undefined1  [16])0x0;
                local_678[0] = 0;
                local_678[1] = 0;
                stack0xfffffffffffff990 = 0;
                uStack_66b = 0;
                iStack_668 = 0;
                bStack_664 = false;
                boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                          ((cpp_dec_float<100u,int,void> *)local_6a8,local_3a8);
                if (((pcVar23->fpclass != cpp_dec_float_NaN) &&
                    ((fpclass_type)local_660 != cpp_dec_float_NaN)) &&
                   (iVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare(pcVar23,(cpp_dec_float<100U,_int,_void> *)local_6a8),
                   iVar19 < 0)) {
                  if ((fpclass_type)local_6b0 == cpp_dec_float_NaN) {
LAB_0037ae6f:
                    pVVar26 = pVVar1;
                  }
                  else {
                    local_5c0._0_4_ = cpp_dec_float_finite;
                    local_5c0._4_4_ = 0x10;
                    local_608 = (undefined1  [16])0x0;
                    local_5f8 = (undefined1  [16])0x0;
                    local_5e8 = (undefined1  [16])0x0;
                    local_5d8[0] = 0;
                    local_5d8[1] = 0;
                    stack0xfffffffffffffa30 = 0;
                    uStack_5cb = 0;
                    iStack_5c8 = 0;
                    bStack_5c4 = false;
                    iVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)local_6f8,
                                     (cpp_dec_float<100U,_int,_void> *)local_608);
                    pVVar26 = local_648;
                    if (iVar19 < 0) goto LAB_0037ae6f;
                  }
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                            (&(pVVar26->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar21].m_backend,
                             (cpp_dec_float<100U,_int,_void> *)local_6f8);
                  goto LAB_0037a385;
                }
              }
              pcVar23 = &(pVVar1->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar21].m_backend;
              ::soplex::infinity::__tls_init();
              local_5c0._0_4_ = cpp_dec_float_finite;
              local_5c0._4_4_ = 0x10;
              local_608 = (undefined1  [16])0x0;
              local_5f8 = (undefined1  [16])0x0;
              local_5e8 = (undefined1  [16])0x0;
              local_5d8[0] = 0;
              local_5d8[1] = 0;
              stack0xfffffffffffffa30 = 0;
              uStack_5cb = 0;
              iStack_5c8 = 0;
              bStack_5c4 = false;
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)local_608,local_628);
              if (((pcVar23->fpclass == cpp_dec_float_NaN) ||
                  ((fpclass_type)local_5c0 == cpp_dec_float_NaN)) ||
                 (iVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (pcVar23,(cpp_dec_float<100U,_int,_void> *)local_608),
                 iVar19 < 1)) {
                pcVar23 = &(local_648->val).
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar21].m_backend;
                local_678[0] = local_6c8[0];
                local_678[1] = local_6c8[1];
                stack0xfffffffffffff990 = stack0xfffffffffffff940;
                uStack_66b = uStack_6bb;
                local_688 = local_6d8;
                local_698 = local_6e8;
                local_6a8 = local_6f8;
                auVar15 = local_6a8;
                iStack_668 = iStack_6b8;
                bStack_664 = bStack_6b4;
                local_660._0_4_ = (fpclass_type)local_6b0;
                local_660._4_4_ = local_6b0._4_4_;
                if ((bStack_6b4 == true) &&
                   (local_6a8._0_4_ = local_6f8._0_4_,
                   (fpclass_type)local_6b0 != cpp_dec_float_finite || local_6a8._0_4_ != 0)) {
                  bStack_664 = false;
                }
                local_5c0._0_4_ = cpp_dec_float_finite;
                local_5c0._4_4_ = 0x10;
                local_608 = (undefined1  [16])0x0;
                local_5f8 = (undefined1  [16])0x0;
                local_5e8 = (undefined1  [16])0x0;
                local_5d8[0] = 0;
                local_5d8[1] = 0;
                stack0xfffffffffffffa30 = 0;
                uStack_5cb = 0;
                iStack_5c8 = 0;
                bStack_5c4 = false;
                if ((cpp_dec_float<100U,_int,_void> *)local_608 != pcVar23) {
                  local_608 = *(undefined1 (*) [16])(pcVar23->data)._M_elems;
                  local_5f8 = *(undefined1 (*) [16])((pcVar23->data)._M_elems + 4);
                  local_5e8 = *(undefined1 (*) [16])((pcVar23->data)._M_elems + 8);
                  local_5d8._0_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 0xc);
                  uVar7 = *(undefined8 *)((pcVar23->data)._M_elems + 0xe);
                  stack0xfffffffffffffa30 = (undefined5)uVar7;
                  uStack_5cb = (undefined3)((ulong)uVar7 >> 0x28);
                  iStack_5c8 = pcVar23->exp;
                  bStack_5c4 = pcVar23->neg;
                  local_5c0._0_4_ = pcVar23->fpclass;
                  local_5c0._4_4_ = pcVar23->prec_elem;
                }
                local_6a8 = auVar15;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          ((cpp_dec_float<100U,_int,_void> *)local_608,
                           (cpp_dec_float<100U,_int,_void> *)local_6a8);
                pnVar25 = (pVVar1->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              }
              else {
                pcVar23 = &(pVVar1->val).
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar21].m_backend;
                local_678[0] = local_6c8[0];
                local_678[1] = local_6c8[1];
                stack0xfffffffffffff990 = stack0xfffffffffffff940;
                uStack_66b = uStack_6bb;
                local_688 = local_6d8;
                local_698 = local_6e8;
                local_6a8 = local_6f8;
                auVar15 = local_6a8;
                iStack_668 = iStack_6b8;
                bStack_664 = bStack_6b4;
                local_660._0_4_ = (fpclass_type)local_6b0;
                local_660._4_4_ = local_6b0._4_4_;
                if ((bStack_6b4 == true) &&
                   (local_6a8._0_4_ = local_6f8._0_4_,
                   (fpclass_type)local_6b0 != cpp_dec_float_finite || local_6a8._0_4_ != 0)) {
                  bStack_664 = false;
                }
                local_5c0._0_4_ = cpp_dec_float_finite;
                local_5c0._4_4_ = 0x10;
                local_608 = (undefined1  [16])0x0;
                local_5f8 = (undefined1  [16])0x0;
                local_5e8 = (undefined1  [16])0x0;
                local_5d8[0] = 0;
                local_5d8[1] = 0;
                stack0xfffffffffffffa30 = 0;
                uStack_5cb = 0;
                iStack_5c8 = 0;
                bStack_5c4 = false;
                if ((cpp_dec_float<100U,_int,_void> *)local_608 != pcVar23) {
                  local_608 = *(undefined1 (*) [16])(pcVar23->data)._M_elems;
                  local_5f8 = *(undefined1 (*) [16])((pcVar23->data)._M_elems + 4);
                  local_5e8 = *(undefined1 (*) [16])((pcVar23->data)._M_elems + 8);
                  local_5d8._0_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 0xc);
                  uVar7 = *(undefined8 *)((pcVar23->data)._M_elems + 0xe);
                  stack0xfffffffffffffa30 = (undefined5)uVar7;
                  uStack_5cb = (undefined3)((ulong)uVar7 >> 0x28);
                  iStack_5c8 = pcVar23->exp;
                  bStack_5c4 = pcVar23->neg;
                  local_5c0._0_4_ = pcVar23->fpclass;
                  local_5c0._4_4_ = pcVar23->prec_elem;
                }
                local_6a8 = auVar15;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          ((cpp_dec_float<100U,_int,_void> *)local_608,
                           (cpp_dec_float<100U,_int,_void> *)local_6a8);
                pnVar25 = (local_648->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              }
              auVar15 = local_608;
              puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 0xc;
              *(undefined8 *)puVar3 = local_5d8._0_8_;
              *(ulong *)(puVar3 + 2) = CONCAT35(uStack_5cb,stack0xfffffffffffffa30);
              puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 8;
              *(undefined8 *)puVar3 = local_5e8._0_8_;
              *(undefined8 *)(puVar3 + 2) = local_5e8._8_8_;
              puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 4;
              *(undefined8 *)puVar3 = local_5f8._0_8_;
              *(undefined8 *)(puVar3 + 2) = local_5f8._8_8_;
              pDVar2 = (DataKey *)(pnVar25 + uVar21);
              pDVar2->info = local_608._0_4_;
              pDVar2->idx = local_608._4_4_;
              pDVar2[1].info = local_608._8_4_;
              pDVar2[1].idx = local_608._12_4_;
              pnVar25[uVar21].m_backend.exp = iStack_5c8;
              pnVar25[uVar21].m_backend.neg = bStack_5c4;
              pnVar25[uVar21].m_backend.fpclass = (fpclass_type)local_5c0;
              pnVar25[uVar21].m_backend.prec_elem = local_5c0._4_4_;
              local_608 = auVar15;
            }
          }
        }
LAB_0037a385:
        bVar18 = MPSInput::readLine((MPSInput *)local_390);
        if (!bVar18) goto LAB_0037af81;
      }
      pcVar22 = (char *)local_390._296_8_;
      if ((local_500 != (SPxOut *)0x0) && (3 < (int)local_500->m_verbosity)) {
        local_608._0_4_ = local_500->m_verbosity;
        local_6a8._0_4_ = 4;
        (*local_500->_vptr_SPxOut[2])(local_500);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar5->m_streams[pSVar5->m_verbosity],"IMPSRD04 Range name     : ",0x1a);
        poVar6 = pSVar5->m_streams[pSVar5->m_verbosity];
        sVar24 = strlen((char *)local_4c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_4c8,sVar24);
        cVar4 = (char)pSVar5->m_streams[pSVar5->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar5->m_streams[pSVar5->m_verbosity] + -0x18) + cVar4);
        std::ostream::put(cVar4);
        std::ostream::flush();
        (*pSVar5->_vptr_SPxOut[2])(pSVar5,local_608);
        pcVar22 = (char *)local_390._296_8_;
      }
      iVar19 = strcmp(pcVar22,"BOUNDS");
      if (iVar19 == 0) {
        local_390._8_4_ = BOUNDS;
        goto LAB_0037af95;
      }
      iVar19 = strcmp(pcVar22,"ENDATA");
      if (iVar19 == 0) {
        local_390._8_4_ = ENDATA;
        goto LAB_0037af95;
      }
    }
LAB_0037af81:
    MPSInput::syntaxError((MPSInput *)local_390);
  }
LAB_0037af95:
  pNVar17 = local_650;
  if (local_390._8_4_ == BOUNDS) {
    pSVar5 = this->spxout;
    DIdxSet::DIdxSet((DIdxSet *)local_6a8,8);
    memset((DataKey *)local_4c8,0,0x100);
    local_5c0._0_4_ = cpp_dec_float_finite;
    local_5c0._4_4_ = 0x10;
    local_608 = (undefined1  [16])0x0;
    local_5f8 = (undefined1  [16])0x0;
    local_5e8 = (undefined1  [16])0x0;
    local_5d8[0] = 0;
    local_5d8[1] = 0;
    stack0xfffffffffffffa30 = 0;
    uStack_5cb = 0;
    iStack_5c8 = 0;
    bStack_5c4 = false;
    local_628 = *(double *)(in_FS_OFFSET + -8);
    uStack_620 = 0;
    local_648 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((ulong)local_628 ^ 0x8000000000000000);
    uStack_640 = 0x8000000000000000;
LAB_0037b044:
    bVar18 = MPSInput::readLine((MPSInput *)local_390);
    if (bVar18) {
      if ((char *)local_390._296_8_ != (char *)0x0) {
        if ((pSVar5 != (SPxOut *)0x0) && (3 < (int)pSVar5->m_verbosity)) {
          local_6f8._0_4_ = pSVar5->m_verbosity;
          local_4f0._0_4_ = 4;
          (*pSVar5->_vptr_SPxOut[2])(pSVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar5->m_streams[pSVar5->m_verbosity],"IMPSRD05 Bound name     : ",0x1a);
          poVar6 = pSVar5->m_streams[pSVar5->m_verbosity];
          sVar24 = strlen((char *)local_4c8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_4c8,sVar24);
          cVar4 = (char)pSVar5->m_streams[pSVar5->m_verbosity];
          std::ios::widen((char)*(undefined8 *)
                                 (*(long *)pSVar5->m_streams[pSVar5->m_verbosity] + -0x18) + cVar4);
          std::ostream::put(cVar4);
          std::ostream::flush();
          (*pSVar5->_vptr_SPxOut[2])(pSVar5,local_6f8);
        }
        iVar19 = strcmp((char *)local_390._296_8_,"ENDATA");
        if (iVar19 == 0) {
          local_390._8_4_ = ENDATA;
          goto LAB_0037ba88;
        }
        goto switchD_0037b4ff_caseD_4e;
      }
      cVar4 = *pcStack_260;
      if (cVar4 == 'F') {
        if (pcStack_260[1] == 'X') goto LAB_0037b0a5;
LAB_0037b0af:
        pcVar22 = (char *)local_258._8_8_;
        if ((char *)local_258._0_8_ != (char *)0x0) {
joined_r0x0037b22e:
          if (pcVar22 == (char *)0x0) {
            MPSInput::insertName((MPSInput *)local_390,"_BND_",true);
            if (pcStack_260 == (char *)0x0) goto switchD_0037b4ff_caseD_4e;
          }
        }
      }
      else {
        if (cVar4 == 'U') {
          if ((pcStack_260[1] == 'I') || (pcStack_260[1] == 'P')) goto LAB_0037b0a5;
          goto LAB_0037b0af;
        }
        if ((cVar4 != 'L') || ((pcStack_260[1] != 'I' && (pcStack_260[1] != 'O'))))
        goto LAB_0037b0af;
LAB_0037b0a5:
        if (pcStack_260[2] != '\0') goto LAB_0037b0af;
        if ((char *)local_258._8_8_ != (char *)0x0) {
          pcVar22 = (char *)local_248._0_8_;
          goto joined_r0x0037b22e;
        }
      }
      if (((char *)local_258._0_8_ == (char *)0x0) || ((char *)local_258._8_8_ == (char *)0x0))
      goto switchD_0037b4ff_caseD_4e;
      if (local_4c8[0] == '\0') {
        spxSnprintf((char *)local_4c8,0x100,"%s");
      }
      iVar19 = strcmp((char *)local_4c8,(char *)local_258._0_8_);
      if (iVar19 == 0) {
        uVar21 = NameSet::number(pNVar17,(char *)local_258._8_8_);
        if ((int)uVar21 < 0) {
          MPSInput::entryIgnored
                    ((MPSInput *)local_390,"column",(char *)local_258._8_8_,"bound",
                     (char *)local_4c8);
          goto LAB_0037b044;
        }
        uVar7 = local_248._0_8_;
        if ((char *)local_248._0_8_ == (char *)0x0) {
          pcVar23 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
          local_608 = *(undefined1 (*) [16])(pcVar23->data)._M_elems;
          local_5f8 = *(undefined1 (*) [16])((pcVar23->data)._M_elems + 4);
          local_5e8 = *(undefined1 (*) [16])((pcVar23->data)._M_elems + 8);
          local_5d8._0_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 0xc);
          uVar7 = *(undefined8 *)((pcVar23->data)._M_elems + 0xe);
          stack0xfffffffffffffa30 = (undefined5)uVar7;
          uStack_5cb = (undefined3)((ulong)uVar7 >> 0x28);
          iStack_5c8 = pcVar23->exp;
          bStack_5c4 = pcVar23->neg;
          local_5c0._0_4_ = pcVar23->fpclass;
          local_5c0._4_4_ = pcVar23->prec_elem;
        }
        else {
          iVar19 = strcmp((char *)local_248._0_8_,"-Inf");
          if ((iVar19 == 0) || (iVar19 = strcmp((char *)uVar7,"-inf"), iVar19 == 0)) {
            ::soplex::infinity::__tls_init();
            local_6b0._0_4_ = cpp_dec_float_finite;
            local_6b0._4_4_ = 0x10;
            local_6f8 = (undefined1  [16])0x0;
            local_6e8 = (undefined1  [16])0x0;
            local_6d8 = (undefined1  [16])0x0;
            local_6c8[0] = 0;
            local_6c8[1] = 0;
            stack0xfffffffffffff940 = 0;
            uStack_6bb = 0;
            iStack_6b8 = 0;
            bStack_6b4 = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)local_6f8,(double)local_648);
          }
          else {
            iVar19 = strcmp((char *)uVar7,"Inf");
            if ((((iVar19 != 0) && (iVar19 = strcmp((char *)uVar7,"inf"), iVar19 != 0)) &&
                (iVar19 = strcmp((char *)uVar7,"+Inf"), iVar19 != 0)) &&
               (iVar19 = strcmp((char *)uVar7,"+inf"), iVar19 != 0)) {
              dVar27 = atof((char *)uVar7);
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)local_608,dVar27);
              goto LAB_0037b3de;
            }
            ::soplex::infinity::__tls_init();
            local_6b0._0_4_ = cpp_dec_float_finite;
            local_6b0._4_4_ = 0x10;
            local_6f8 = (undefined1  [16])0x0;
            local_6e8 = (undefined1  [16])0x0;
            local_6d8 = (undefined1  [16])0x0;
            local_6c8[0] = 0;
            local_6c8[1] = 0;
            stack0xfffffffffffff940 = 0;
            uStack_6bb = 0;
            iStack_6b8 = 0;
            bStack_6b4 = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)local_6f8,local_628);
          }
          local_5d8[0] = local_6c8[0];
          local_5d8[1] = local_6c8[1];
          stack0xfffffffffffffa30 = stack0xfffffffffffff940;
          uStack_5cb = uStack_6bb;
          local_5e8 = local_6d8;
          local_5f8 = local_6e8;
          local_608 = local_6f8;
          iStack_5c8 = iStack_6b8;
          bStack_5c4 = bStack_6b4;
          local_5c0._0_4_ = (fpclass_type)local_6b0;
          local_5c0._4_4_ = local_6b0._4_4_;
        }
LAB_0037b3de:
        if (pcStack_260[1] == 'I') {
          if (local_610 != (DIdxSet *)0x0) {
            DIdxSet::addIdx(local_610,uVar21);
          }
          iVar19 = IdxSet::pos((IdxSet *)local_6a8,uVar21);
          if (iVar19 < 0) {
            ::soplex::infinity::__tls_init();
            local_6b0._0_4_ = cpp_dec_float_finite;
            local_6b0._4_4_ = 0x10;
            local_6f8 = (undefined1  [16])0x0;
            local_6e8 = (undefined1  [16])0x0;
            local_6d8 = (undefined1  [16])0x0;
            local_6c8[0] = 0;
            local_6c8[1] = 0;
            stack0xfffffffffffff940 = 0;
            uStack_6bb = 0;
            iStack_6b8 = 0;
            bStack_6b4 = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)local_6f8,local_628);
            auVar15 = local_6f8;
            pnVar25 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 0xc;
            *(undefined8 *)puVar3 = local_6c8._0_8_;
            *(ulong *)(puVar3 + 2) = CONCAT35(uStack_6bb,stack0xfffffffffffff940);
            puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 8;
            *(undefined8 *)puVar3 = local_6d8._0_8_;
            *(undefined8 *)(puVar3 + 2) = local_6d8._8_8_;
            puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar3 = local_6e8._0_8_;
            *(undefined8 *)(puVar3 + 2) = local_6e8._8_8_;
            pDVar2 = (DataKey *)(pnVar25 + uVar21);
            pDVar2->info = local_6f8._0_4_;
            pDVar2->idx = local_6f8._4_4_;
            pDVar2[1].info = local_6f8._8_4_;
            pDVar2[1].idx = local_6f8._12_4_;
            pnVar25[uVar21].m_backend.exp = iStack_6b8;
            pnVar25[uVar21].m_backend.neg = bStack_6b4;
            pnVar25[uVar21].m_backend.fpclass = (fpclass_type)local_6b0;
            pnVar25[uVar21].m_backend.prec_elem = local_6b0._4_4_;
            local_6f8 = auVar15;
            DIdxSet::addIdx((DIdxSet *)local_6a8,uVar21);
          }
        }
        auVar15 = local_608;
        cVar4 = *pcStack_260;
        switch(cVar4) {
        case 'L':
          pnVar25 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          break;
        case 'M':
          ::soplex::infinity::__tls_init();
          local_6b0._0_4_ = cpp_dec_float_finite;
          local_6b0._4_4_ = 0x10;
          local_6f8 = (undefined1  [16])0x0;
          local_6e8 = (undefined1  [16])0x0;
          local_6d8 = (undefined1  [16])0x0;
          local_6c8[0] = 0;
          local_6c8[1] = 0;
          stack0xfffffffffffff940 = 0;
          uStack_6bb = 0;
          iStack_6b8 = 0;
          bStack_6b4 = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)local_6f8,(double)local_648);
          pnVar25 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_0037b6f1;
        case 'N':
        case 'O':
        case 'Q':
        case 'R':
        case 'S':
        case 'T':
          goto switchD_0037b4ff_caseD_4e;
        case 'P':
          ::soplex::infinity::__tls_init();
          local_6b0._0_4_ = cpp_dec_float_finite;
          local_6b0._4_4_ = 0x10;
          local_6f8 = (undefined1  [16])0x0;
          local_6e8 = (undefined1  [16])0x0;
          local_6d8 = (undefined1  [16])0x0;
          local_6c8[0] = 0;
          local_6c8[1] = 0;
          stack0xfffffffffffff940 = 0;
          uStack_6bb = 0;
          iStack_6b8 = 0;
          bStack_6b4 = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)local_6f8,local_628);
          pnVar25 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
LAB_0037b6f1:
          auVar15 = local_6f8;
          puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 0xc;
          *(undefined8 *)puVar3 = local_6c8._0_8_;
          *(ulong *)(puVar3 + 2) = CONCAT35(uStack_6bb,stack0xfffffffffffff940);
          puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 8;
          *(undefined8 *)puVar3 = local_6d8._0_8_;
          *(undefined8 *)(puVar3 + 2) = local_6d8._8_8_;
          puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar3 = local_6e8._0_8_;
          *(undefined8 *)(puVar3 + 2) = local_6e8._8_8_;
          pDVar2 = (DataKey *)(pnVar25 + uVar21);
          pDVar2->info = local_6f8._0_4_;
          pDVar2->idx = local_6f8._4_4_;
          pDVar2[1].info = local_6f8._8_4_;
          pDVar2[1].idx = local_6f8._12_4_;
          pnVar25[uVar21].m_backend.exp = iStack_6b8;
          pnVar25[uVar21].m_backend.neg = bStack_6b4;
          pnVar25[uVar21].m_backend.fpclass = (fpclass_type)local_6b0;
          pnVar25[uVar21].m_backend.prec_elem = local_6b0._4_4_;
          local_6f8 = auVar15;
          goto LAB_0037b044;
        case 'U':
          pnVar25 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          break;
        default:
          if (cVar4 == 'B') {
            pnVar25 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcVar23 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
            uVar7 = *(undefined8 *)(pcVar23->data)._M_elems;
            uVar8 = *(undefined8 *)((pcVar23->data)._M_elems + 2);
            uVar9 = *(undefined8 *)((pcVar23->data)._M_elems + 4);
            uVar10 = *(undefined8 *)((pcVar23->data)._M_elems + 6);
            uVar11 = *(undefined8 *)((pcVar23->data)._M_elems + 8);
            uVar12 = *(undefined8 *)((pcVar23->data)._M_elems + 10);
            uVar13 = *(undefined8 *)((pcVar23->data)._M_elems + 0xe);
            puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 0xc;
            *(undefined8 *)puVar3 = *(undefined8 *)((pcVar23->data)._M_elems + 0xc);
            *(undefined8 *)(puVar3 + 2) = uVar13;
            puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 8;
            *(undefined8 *)puVar3 = uVar11;
            *(undefined8 *)(puVar3 + 2) = uVar12;
            puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar3 = uVar9;
            *(undefined8 *)(puVar3 + 2) = uVar10;
            *(undefined8 *)&pnVar25[uVar21].m_backend.data = uVar7;
            *(undefined8 *)(pnVar25[uVar21].m_backend.data._M_elems + 2) = uVar8;
            pnVar25[uVar21].m_backend.exp = pcVar23->exp;
            pnVar25[uVar21].m_backend.neg = pcVar23->neg;
            iVar14 = pcVar23->prec_elem;
            pnVar25[uVar21].m_backend.fpclass = pcVar23->fpclass;
            pnVar25[uVar21].m_backend.prec_elem = iVar14;
            pnVar25 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcVar23 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::one();
            uVar9 = *(undefined8 *)(pcVar23->data)._M_elems;
            uVar10 = *(undefined8 *)((pcVar23->data)._M_elems + 2);
            uVar7 = *(undefined8 *)((pcVar23->data)._M_elems + 4);
            uVar8 = *(undefined8 *)((pcVar23->data)._M_elems + 6);
            uVar11 = *(undefined8 *)((pcVar23->data)._M_elems + 8);
            uVar12 = *(undefined8 *)((pcVar23->data)._M_elems + 10);
            uVar13 = *(undefined8 *)((pcVar23->data)._M_elems + 0xe);
            puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 0xc;
            *(undefined8 *)puVar3 = *(undefined8 *)((pcVar23->data)._M_elems + 0xc);
            *(undefined8 *)(puVar3 + 2) = uVar13;
            puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 8;
            *(undefined8 *)puVar3 = uVar11;
            *(undefined8 *)(puVar3 + 2) = uVar12;
            puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar3 = uVar7;
            *(undefined8 *)(puVar3 + 2) = uVar8;
            *(undefined8 *)&pnVar25[uVar21].m_backend.data = uVar9;
            *(undefined8 *)(pnVar25[uVar21].m_backend.data._M_elems + 2) = uVar10;
            pnVar25[uVar21].m_backend.exp = pcVar23->exp;
            pnVar25[uVar21].m_backend.neg = pcVar23->neg;
            iVar14 = pcVar23->prec_elem;
            pnVar25[uVar21].m_backend.fpclass = pcVar23->fpclass;
            pnVar25[uVar21].m_backend.prec_elem = iVar14;
            if (local_610 != (DIdxSet *)0x0) {
              DIdxSet::addIdx(local_610,uVar21);
            }
            goto LAB_0037b044;
          }
          if (cVar4 != 'F') goto switchD_0037b4ff_caseD_4e;
          if (pcStack_260[1] != 'X') {
            ::soplex::infinity::__tls_init();
            local_6b0._0_4_ = cpp_dec_float_finite;
            local_6b0._4_4_ = 0x10;
            local_6f8 = (undefined1  [16])0x0;
            local_6e8 = (undefined1  [16])0x0;
            local_6d8 = (undefined1  [16])0x0;
            local_6c8[0] = 0;
            local_6c8[1] = 0;
            stack0xfffffffffffff940 = 0;
            uStack_6bb = 0;
            iStack_6b8 = 0;
            bStack_6b4 = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)local_6f8,(double)local_648);
            auVar15 = local_6f8;
            pnVar25 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 0xc;
            *(undefined8 *)puVar3 = local_6c8._0_8_;
            *(ulong *)(puVar3 + 2) = CONCAT35(uStack_6bb,stack0xfffffffffffff940);
            puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 8;
            *(undefined8 *)puVar3 = local_6d8._0_8_;
            *(undefined8 *)(puVar3 + 2) = local_6d8._8_8_;
            puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar3 = local_6e8._0_8_;
            *(undefined8 *)(puVar3 + 2) = local_6e8._8_8_;
            pDVar2 = (DataKey *)(pnVar25 + uVar21);
            pDVar2->info = local_6f8._0_4_;
            pDVar2->idx = local_6f8._4_4_;
            pDVar2[1].info = local_6f8._8_4_;
            pDVar2[1].idx = local_6f8._12_4_;
            pnVar25[uVar21].m_backend.exp = iStack_6b8;
            pnVar25[uVar21].m_backend.neg = bStack_6b4;
            pnVar25[uVar21].m_backend.fpclass = (fpclass_type)local_6b0;
            pnVar25[uVar21].m_backend.prec_elem = local_6b0._4_4_;
            local_6f8 = auVar15;
            ::soplex::infinity::__tls_init();
            local_6b0._0_4_ = cpp_dec_float_finite;
            local_6b0._4_4_ = 0x10;
            local_6f8 = (undefined1  [16])0x0;
            local_6e8 = (undefined1  [16])0x0;
            local_6d8 = (undefined1  [16])0x0;
            local_6c8[0] = 0;
            local_6c8[1] = 0;
            stack0xfffffffffffff940 = 0;
            uStack_6bb = 0;
            iStack_6b8 = 0;
            bStack_6b4 = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)local_6f8,local_628);
            auVar15 = local_6f8;
            pnVar25 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 0xc;
            *(undefined8 *)puVar3 = local_6c8._0_8_;
            *(ulong *)(puVar3 + 2) = CONCAT35(uStack_6bb,stack0xfffffffffffff940);
            puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 8;
            *(undefined8 *)puVar3 = local_6d8._0_8_;
            *(undefined8 *)(puVar3 + 2) = local_6d8._8_8_;
            puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar3 = local_6e8._0_8_;
            *(undefined8 *)(puVar3 + 2) = local_6e8._8_8_;
            pDVar2 = (DataKey *)(pnVar25 + uVar21);
            pDVar2->info = local_6f8._0_4_;
            pDVar2->idx = local_6f8._4_4_;
            pDVar2[1].info = local_6f8._8_4_;
            pDVar2[1].idx = local_6f8._12_4_;
            pnVar25[uVar21].m_backend.exp = iStack_6b8;
            pnVar25[uVar21].m_backend.neg = bStack_6b4;
            pnVar25[uVar21].m_backend.fpclass = (fpclass_type)local_6b0;
            pnVar25[uVar21].m_backend.prec_elem = local_6b0._4_4_;
            local_6f8 = auVar15;
            goto LAB_0037b044;
          }
          pnVar25 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 0xc;
          *(undefined8 *)puVar3 = local_5d8._0_8_;
          *(ulong *)(puVar3 + 2) = CONCAT35(uStack_5cb,stack0xfffffffffffffa30);
          puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 8;
          *(undefined8 *)puVar3 = local_5e8._0_8_;
          *(undefined8 *)(puVar3 + 2) = local_5e8._8_8_;
          puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar3 = local_5f8._0_8_;
          *(undefined8 *)(puVar3 + 2) = local_5f8._8_8_;
          pDVar2 = (DataKey *)(pnVar25 + uVar21);
          pDVar2->info = local_608._0_4_;
          pDVar2->idx = local_608._4_4_;
          pDVar2[1].info = local_608._8_4_;
          pDVar2[1].idx = local_608._12_4_;
          pnVar25[uVar21].m_backend.exp = iStack_5c8;
          pnVar25[uVar21].m_backend.neg = bStack_5c4;
          pnVar25[uVar21].m_backend.fpclass = (fpclass_type)local_5c0;
          pnVar25[uVar21].m_backend.prec_elem = local_5c0._4_4_;
          pnVar25 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 0xc;
        *(undefined8 *)puVar3 = local_5d8._0_8_;
        *(ulong *)(puVar3 + 2) = CONCAT35(uStack_5cb,stack0xfffffffffffffa30);
        puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 8;
        *(undefined8 *)puVar3 = local_5e8._0_8_;
        *(undefined8 *)(puVar3 + 2) = local_5e8._8_8_;
        puVar3 = pnVar25[uVar21].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar3 = local_5f8._0_8_;
        *(undefined8 *)(puVar3 + 2) = local_5f8._8_8_;
        pDVar2 = (DataKey *)(pnVar25 + uVar21);
        pDVar2->info = local_608._0_4_;
        pDVar2->idx = local_608._4_4_;
        pDVar2[1].info = local_608._8_4_;
        pDVar2[1].idx = local_608._12_4_;
        pnVar25[uVar21].m_backend.exp = iStack_5c8;
        pnVar25[uVar21].m_backend.neg = bStack_5c4;
        *(undefined8 *)&pnVar25[uVar21].m_backend.fpclass = local_5c0;
        local_608 = auVar15;
      }
      goto LAB_0037b044;
    }
switchD_0037b4ff_caseD_4e:
    MPSInput::syntaxError((MPSInput *)local_390);
LAB_0037ba88:
    DIdxSet::~DIdxSet((DIdxSet *)local_6a8);
  }
  if (local_390._8_4_ != ENDATA) {
    MPSInput::syntaxError((MPSInput *)local_390);
  }
  if ((bool)local_390[0x20] == true) {
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x1b])();
  }
  else {
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x45])
              (this,(ulong)(((local_390._28_4_ != MINIMIZE) - 1) +
                           (uint)(local_390._28_4_ != MINIMIZE)));
    pSVar5 = this->spxout;
    if ((pSVar5 != (SPxOut *)0x0) && (3 < (int)pSVar5->m_verbosity)) {
      local_4c8._0_4_ = pSVar5->m_verbosity;
      local_608._0_4_ = 4;
      (*pSVar5->_vptr_SPxOut[2])();
      pSVar5 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar5->m_streams[pSVar5->m_verbosity],"IMPSRD06 Objective sense: ",0x1a);
      pcVar22 = "Maximize\n";
      if (local_390._28_4_ == MINIMIZE) {
        pcVar22 = "Minimize\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar5->m_streams[pSVar5->m_verbosity],pcVar22,9);
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,(DataKey *)local_4c8);
    }
    added2Set(this,(SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)this,
              &local_4f8->
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,(this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x51])
              (this,(ulong)(uint)(this->
                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).
                                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .set.thenum);
  }
  if (local_4d0 == (NameSet *)0x0) {
    NameSet::~NameSet(local_650);
    free(local_650);
    local_650 = (NameSet *)0x0;
  }
  if (local_3b0 == (NameSet *)0x0) {
    NameSet::~NameSet(local_630);
    free(local_630);
  }
  return (bool)(local_390[0x20] ^ 1);
}

Assistant:

inline
bool SPxLPBase<R>::readMPS(
   std::istream& p_input,           ///< input stream.
   NameSet*      p_rnames,          ///< row names.
   NameSet*      p_cnames,          ///< column names.
   DIdxSet*      p_intvars)         ///< integer variables.
{
   LPRowSetBase<R>& rset = *this;
   LPColSetBase<R>& cset = *this;
   NameSet* rnames;
   NameSet* cnames;

   if(p_cnames)
      cnames = p_cnames;
   else
   {
      cnames = nullptr;
      spx_alloc(cnames);
      cnames = new(cnames) NameSet();
   }

   cnames->clear();

   if(p_rnames)
      rnames = p_rnames;
   else
   {
      try
      {
         rnames = nullptr;
         spx_alloc(rnames);
         rnames = new(rnames) NameSet();
      }
      catch(const SPxMemoryException& x)
      {
         if(!p_cnames)
         {
            cnames->~NameSet();
            spx_free(cnames);
         }

         throw x;
      }
   }

   rnames->clear();

   SPxLPBase<R>::clear(); // clear the LP.

   cset.memRemax(Init_NZos);
   cset.reMax(Init_Cols);

   MPSInput mps(p_input);

   MPSreadName(mps, spxout);

   if(mps.section() == MPSInput::OBJSEN)
      MPSreadObjsen(mps);

   if(mps.section() == MPSInput::OBJNAME)
      MPSreadObjname(mps);

   if(mps.section() == MPSInput::ROWS)
      MPSreadRows(mps, rset, *rnames, spxout);

   addedRows(rset.num());

   if(mps.section() == MPSInput::COLUMNS)
      MPSreadCols(mps, rset, *rnames, cset, *cnames, p_intvars);

   if(mps.section() == MPSInput::RHS)
      MPSreadRhs(mps, rset, *rnames, spxout);

   if(mps.section() == MPSInput::RANGES)
      MPSreadRanges(mps, rset, *rnames, spxout);

   if(mps.section() == MPSInput::BOUNDS)
      MPSreadBounds(mps, cset, *cnames, p_intvars, spxout);

   if(mps.section() != MPSInput::ENDATA)
      mps.syntaxError();

   if(mps.hasError())
      clear();
   else
   {
      changeSense(mps.objSense() == MPSInput::MINIMIZE ? SPxLPBase<R>::MINIMIZE : SPxLPBase<R>::MAXIMIZE);

      SPX_MSG_INFO2((*spxout), (*spxout) << "IMPSRD06 Objective sense: " << ((mps.objSense() ==
                    MPSInput::MINIMIZE) ? "Minimize\n" : "Maximize\n"));

      added2Set(
         *(reinterpret_cast<SVSetBase<R>*>(static_cast<LPRowSetBase<R>*>(this))),
         *(reinterpret_cast<SVSetBase<R>*>(static_cast<LPColSetBase<R>*>(this))),
         cset.num());
      addedCols(cset.num());

      assert(isConsistent());
   }

   if(p_cnames == nullptr)
   {
      cnames->~NameSet();
      spx_free(cnames);
   }

   if(p_rnames == nullptr)
   {
      rnames->~NameSet();
      spx_free(rnames);
   }

   return !mps.hasError();
}